

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O3

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering>
                 (DB *db,LIST *params,IfcSurfaceStyleRendering *in)

{
  pointer psVar1;
  element_type *peVar2;
  size_t sVar3;
  long lVar4;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  InternGenericConvert<double> local_81;
  string local_80;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> local_60 [3];
  
  sVar3 = GenericFill<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                    (db,params,&in->super_IfcSurfaceStyleShading);
  psVar1 = (params->members).
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x80 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1)) {
    local_60[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[sVar3].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_60[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar3].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_60[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    lVar4 = __dynamic_cast(local_60[0].
                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      InternGenericConvert<double>::operator()
                (&local_81,(double *)&(in->super_IfcSurfaceStyleShading).field_0x28,local_60,db);
      in->field_0x30 = 1;
    }
    if (local_60[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60[0].
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 1].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 1].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->DiffuseColour).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->DiffuseColour).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->DiffuseColour).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 2].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 2].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->TransmissionColour).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->TransmissionColour).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->TransmissionColour).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 3].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 3].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->DiffuseTransmissionColour).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->DiffuseTransmissionColour).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->DiffuseTransmissionColour).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 4].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 4].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->ReflectionColour).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->ReflectionColour).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->ReflectionColour).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 5].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 5].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->SpecularColour).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->SpecularColour).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->SpecularColour).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar3 + 6].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80._M_string_length =
         (size_type)
         psVar1[sVar3 + 6].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)peVar2;
    lVar4 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar4 == 0) {
      (in->SpecularHighlight).ptr.
      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(in->SpecularHighlight).ptr.
                  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      (in->SpecularHighlight).have = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_60[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar1[sVar3 + 7].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_60[0].
    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar3 + 7].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_60[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60[0].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60[0].
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((InternGenericConvert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_81,&in->ReflectanceMethod,local_60,db);
    if (local_60[0].
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60[0].
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return sVar3 + 8;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"expected 9 arguments to IfcSurfaceStyleRendering","");
  TypeError::TypeError(this,&local_80,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcSurfaceStyleRendering>(const DB& db, const LIST& params, IfcSurfaceStyleRendering* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcSurfaceStyleShading*>(in));
	if (params.GetSize() < 9) { throw STEP::TypeError("expected 9 arguments to IfcSurfaceStyleRendering"); }    do { // convert the 'Transparency' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->Transparency, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcSurfaceStyleRendering to be a `IfcNormalisedRatioMeasure`")); }
    } while(0);
    do { // convert the 'DiffuseColour' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->DiffuseColour, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcSurfaceStyleRendering to be a `IfcColourOrFactor`")); }
    } while(0);
    do { // convert the 'TransmissionColour' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->TransmissionColour, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 3 to IfcSurfaceStyleRendering to be a `IfcColourOrFactor`")); }
    } while(0);
    do { // convert the 'DiffuseTransmissionColour' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->DiffuseTransmissionColour, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcSurfaceStyleRendering to be a `IfcColourOrFactor`")); }
    } while(0);
    do { // convert the 'ReflectionColour' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->ReflectionColour, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 5 to IfcSurfaceStyleRendering to be a `IfcColourOrFactor`")); }
    } while(0);
    do { // convert the 'SpecularColour' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->SpecularColour, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 6 to IfcSurfaceStyleRendering to be a `IfcColourOrFactor`")); }
    } while(0);
    do { // convert the 'SpecularHighlight' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->SpecularHighlight, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 7 to IfcSurfaceStyleRendering to be a `IfcSpecularHighlightSelect`")); }
    } while(0);
    do { // convert the 'ReflectanceMethod' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->ReflectanceMethod, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 8 to IfcSurfaceStyleRendering to be a `IfcReflectanceMethodEnum`")); }
    } while(0);
	return base;
}